

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int libssh2_session_disconnect_ex(LIBSSH2_SESSION *session,int reason,char *desc,char *lang)

{
  int iVar1;
  time_t start_time;
  size_t len;
  size_t data2_len;
  char *errmsg;
  uchar *local_38;
  
  *(byte *)&session->state = (byte)session->state & 0xfe;
  start_time = time((time_t *)0x0);
  do {
    if (session->disconnect_state == libssh2_NB_state_idle) {
      if (desc == (char *)0x0) {
        len = 0;
        data2_len = 0;
        if (lang != (char *)0x0) {
LAB_001204c0:
          data2_len = strlen(lang);
          errmsg = "too long language string";
          if (0x100 < data2_len) goto LAB_001204e5;
        }
LAB_00120506:
        session->disconnect_data_len = data2_len + len + 0xd;
        session->disconnect_data[0] = '\x01';
        local_38 = session->disconnect_data + 1;
        _libssh2_store_u32(&local_38,reason);
        _libssh2_store_str(&local_38,desc,len);
        _libssh2_store_u32(&local_38,(uint32_t)data2_len);
        session->disconnect_state = libssh2_NB_state_created;
        goto LAB_00120572;
      }
      len = strlen(desc);
      errmsg = "too long description";
      if (lang == (char *)0x0) {
        if (len < 0x101) {
          data2_len = 0;
          goto LAB_00120506;
        }
      }
      else if (len < 0x101) goto LAB_001204c0;
LAB_001204e5:
      iVar1 = _libssh2_error(session,-0x22,errmsg);
      if (iVar1 != -0x25) {
        return iVar1;
      }
    }
    else {
      data2_len = 0;
LAB_00120572:
      iVar1 = _libssh2_transport_send
                        (session,session->disconnect_data,session->disconnect_data_len,(uchar *)lang
                         ,data2_len);
      if (iVar1 != -0x25) {
        session->disconnect_state = libssh2_NB_state_idle;
        return 0;
      }
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_session_disconnect_ex(LIBSSH2_SESSION *session, int reason,
                              const char *desc, const char *lang)
{
    int rc;
    session->state &= ~LIBSSH2_STATE_EXCHANGING_KEYS;
    BLOCK_ADJUST(rc, session,
                 session_disconnect(session, reason, desc, lang));

    return rc;
}